

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O2

string * __thiscall
flatbuffers::dart::DartGenerator::GenType_abi_cxx11_
          (string *__return_storage_ptr__,DartGenerator *this,Type *type)

{
  char *__s;
  undefined1 local_30 [32];
  
  switch(type->base_type) {
  case BASE_TYPE_UTYPE:
  case BASE_TYPE_UCHAR:
    __s = "Uint8";
    break;
  case BASE_TYPE_BOOL:
    __s = "Bool";
    break;
  case BASE_TYPE_CHAR:
    __s = "Int8";
    break;
  case BASE_TYPE_SHORT:
    __s = "Int16";
    break;
  case BASE_TYPE_USHORT:
    __s = "Uint16";
    break;
  case BASE_TYPE_INT:
    __s = "Int32";
    break;
  case BASE_TYPE_UINT:
    __s = "Uint32";
    break;
  case BASE_TYPE_LONG:
    __s = "Int64";
    break;
  case BASE_TYPE_ULONG:
    __s = "Uint64";
    break;
  case BASE_TYPE_FLOAT:
    __s = "Float32";
    break;
  case BASE_TYPE_DOUBLE:
    __s = "Float64";
    break;
  case BASE_TYPE_STRING:
    __s = "String";
    break;
  case BASE_TYPE_VECTOR:
    local_30._0_4_ = type->element;
    local_30._24_2_ = type->fixed_length;
    local_30._4_4_ = BASE_TYPE_NONE;
    local_30._8_8_ = type->struct_def;
    local_30._16_8_ = type->enum_def;
    GenType_abi_cxx11_(__return_storage_ptr__,this,(Type *)local_30);
    return __return_storage_ptr__;
  case BASE_TYPE_STRUCT:
    (*(this->namer_).super_Namer._vptr_Namer[0xf])
              (__return_storage_ptr__,&this->namer_,type->struct_def);
    return __return_storage_ptr__;
  case BASE_TYPE_UNION:
    (*(this->namer_).super_Namer._vptr_Namer[0xf])
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
               &this->namer_,type->enum_def);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                   "TypeId");
    std::__cxx11::string::~string((string *)local_30);
    return __return_storage_ptr__;
  default:
    __s = "Table";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string GenType(const Type &type) {
    switch (type.base_type) {
      case BASE_TYPE_BOOL: return "Bool";
      case BASE_TYPE_CHAR: return "Int8";
      case BASE_TYPE_UTYPE:
      case BASE_TYPE_UCHAR: return "Uint8";
      case BASE_TYPE_SHORT: return "Int16";
      case BASE_TYPE_USHORT: return "Uint16";
      case BASE_TYPE_INT: return "Int32";
      case BASE_TYPE_UINT: return "Uint32";
      case BASE_TYPE_LONG: return "Int64";
      case BASE_TYPE_ULONG: return "Uint64";
      case BASE_TYPE_FLOAT: return "Float32";
      case BASE_TYPE_DOUBLE: return "Float64";
      case BASE_TYPE_STRING: return "String";
      case BASE_TYPE_VECTOR: return GenType(type.VectorType());
      case BASE_TYPE_STRUCT: return namer_.Type(*type.struct_def);
      case BASE_TYPE_UNION: return namer_.Type(*type.enum_def) + "TypeId";
      default: return "Table";
    }
  }